

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O1

double variance(int *I_l,int n_int)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = 0.0;
  dVar4 = 0.0;
  if (0 < n_int) {
    iVar1 = 0;
    uVar2 = 1;
    do {
      iVar1 = iVar1 + I_l[uVar2];
      uVar2 = uVar2 + 1;
    } while (n_int + 1 != uVar2);
    dVar4 = (double)iVar1;
  }
  if (0 < n_int) {
    dVar3 = 0.0;
    uVar2 = 1;
    do {
      dVar5 = (double)I_l[uVar2] - dVar4 / (double)n_int;
      dVar3 = dVar3 + dVar5 * dVar5;
      uVar2 = uVar2 + 1;
    } while (n_int + 1 != uVar2);
  }
  return dVar3 / (double)(n_int + -1);
}

Assistant:

double variance(int* I_l, int n_int)
{
    double l_mean = double(sum(I_l,n_int)) / n_int;
    double l_var = 0;

    for(int i=1; i<=n_int; i++)
    {
        l_var += pow(I_l[i]-l_mean, 2);
    }

    l_var /= n_int-1;
    return l_var;
}